

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O0

void __thiscall
KokkosTools::ChromeTracing::State::begin_deep_copy
          (State *this,Space dst,char *dst_name,void *param_3,Space src,char *src_name,void *param_6
          ,uint64_t len)

{
  char *name;
  string local_88;
  string local_58 [8];
  string frame_name;
  char *src_name_local;
  Space src_local;
  void *param_3_local;
  char *dst_name_local;
  Space dst_local;
  State *this_local;
  
  frame_name.field_2._8_8_ = src_name;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::operator+=(local_58,dst_name);
  std::__cxx11::string::operator+=(local_58," SPACE ");
  std::__cxx11::string::operator+=(local_58,(dst == SPACE_HOST) * '\x04' + 'D');
  std::__cxx11::string::operator+=(local_58," COPYFROM ");
  std::__cxx11::string::operator+=(local_58,(char *)frame_name.field_2._8_8_);
  std::__cxx11::string::operator+=(local_58," SPACE ");
  std::__cxx11::string::operator+=(local_58,(src == SPACE_HOST) * '\x04' + 'D');
  std::__cxx11::string::operator+=(local_58," LENGTH ");
  std::__cxx11::to_string(&local_88,len);
  std::__cxx11::string::operator+=(local_58,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::operator+=(local_58," ");
  name = (char *)std::__cxx11::string::c_str();
  begin_frame(this,name,STACK_COPY);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void begin_deep_copy(Space dst, const char *dst_name, const void *, Space src,
                       const char *src_name, const void *, std::uint64_t len) {
    std::string frame_name;
    frame_name += dst_name;
    frame_name += " SPACE ";
    frame_name += (dst == SPACE_HOST) ? 'H' : 'D';
    frame_name += " COPYFROM ";
    frame_name += src_name;
    frame_name += " SPACE ";
    frame_name += (src == SPACE_HOST) ? 'H' : 'D';
    frame_name += " LENGTH ";
    frame_name += std::to_string(len);
    frame_name += " ";
    begin_frame(frame_name.c_str(), STACK_COPY);
  }